

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_content_type.cpp
# Opt level: O2

void __thiscall cppcms::http::content_type::content_type(content_type *this,char *s)

{
  data *this_00;
  size_t sVar1;
  
  this_00 = (data *)operator_new(0x90);
  memset(this_00,0,0x90);
  data::data(this_00);
  std::__shared_ptr<cppcms::http::content_type::data,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::http::content_type::data,void>
            ((__shared_ptr<cppcms::http::content_type::data,(__gnu_cxx::_Lock_policy)2> *)this,
             this_00);
  sVar1 = strlen(s);
  parse(this,s,s + sVar1);
  return;
}

Assistant:

content_type::content_type(char const *s) :
		d(new content_type::data())
	{
		char const *begin = s;
		char const *end = s + strlen(s);
		parse(begin,end);
	}